

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_key.c
# Opt level: O0

int write_private_key(mbedtls_pk_context *key,char *output_file)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  size_t local_3ec8;
  size_t len;
  uchar *c;
  uchar output_buf [16000];
  FILE *f;
  int ret;
  char *output_file_local;
  mbedtls_pk_context *key_local;
  
  len = (size_t)&c;
  memset(&c,0,16000);
  if (opt.format == 0) {
    iVar1 = mbedtls_pk_write_key_pem(key,(uchar *)&c,16000);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_3ec8 = strlen((char *)&c);
  }
  else {
    iVar1 = mbedtls_pk_write_key_der(key,(uchar *)&c,16000);
    if (iVar1 < 0) {
      return iVar1;
    }
    local_3ec8 = (size_t)iVar1;
    len = (size_t)(output_buf + (0x3e78 - local_3ec8));
  }
  __s = fopen(output_file,"wb");
  if (__s == (FILE *)0x0) {
    key_local._4_4_ = -1;
  }
  else {
    sVar2 = fwrite((void *)len,1,local_3ec8,__s);
    if (sVar2 == local_3ec8) {
      fclose(__s);
      key_local._4_4_ = 0;
    }
    else {
      fclose(__s);
      key_local._4_4_ = -1;
    }
  }
  return key_local._4_4_;
}

Assistant:

static int write_private_key( mbedtls_pk_context *key, const char *output_file )
{
    int ret;
    FILE *f;
    unsigned char output_buf[16000];
    unsigned char *c = output_buf;
    size_t len = 0;

    memset(output_buf, 0, 16000);
    if( opt.format == FORMAT_PEM )
    {
        if( ( ret = mbedtls_pk_write_key_pem( key, output_buf, 16000 ) ) != 0 )
            return( ret );

        len = strlen( (char *) output_buf );
    }
    else
    {
        if( ( ret = mbedtls_pk_write_key_der( key, output_buf, 16000 ) ) < 0 )
            return( ret );

        len = ret;
        c = output_buf + sizeof(output_buf) - len;
    }

    if( ( f = fopen( output_file, "wb" ) ) == NULL )
        return( -1 );

    if( fwrite( c, 1, len, f ) != len )
    {
        fclose( f );
        return( -1 );
    }

    fclose( f );

    return( 0 );
}